

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::
GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
::HandleRefSchema(GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                  *this,PointerType *source,SchemaType **schema,ValueType *v,ValueType *document,
                 UriType *id)

{
  IRemoteSchemaDocumentProviderType *pIVar1;
  Ch *pCVar2;
  bool bVar3;
  SizeType SVar4;
  ConstMemberIterator CVar5;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  **ppGVar6;
  ValueType *pVVar7;
  size_t sVar8;
  GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *v_00;
  SchemaType *pSVar9;
  ulong uVar10;
  size_t len;
  SchemaErrorCode code;
  ulong uVar11;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  *pGVar12;
  char *pcVar13;
  CrtAllocator *pCVar14;
  PointerType pointer_2;
  PointerType pointer;
  UriType ref;
  size_t unresolvedTokenIndex;
  UriType scopeId;
  size_t unresolvedTokenIndex_1;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_248;
  UriType *local_1f8;
  undefined1 local_1f0 [64];
  CrtAllocator *local_1b0;
  char *local_188;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_170;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_138;
  size_t local_f0;
  GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> local_e8;
  PointerType local_b8;
  GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
  local_78;
  
  internal::
  Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
  ::GetRefString();
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
  FindMember<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              *)&local_138,v);
  pCVar2 = local_138.uri_;
  CVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::MemberEnd(v);
  if ((Pointer)pCVar2 == CVar5.ptr_) goto LAB_001407d3;
  local_e8.stack_.stack_ = (char *)0x0;
  local_e8.stack_.stackTop_ = (char *)0x0;
  local_e8.stack_.allocator_ = (CrtAllocator *)0x0;
  local_e8.stack_.ownAllocator_ = (CrtAllocator *)0x0;
  local_e8.stack_.stackEnd_ = (char *)0x0;
  local_e8.stack_.initialCapacity_ = 0x100;
  GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
  ::Stringify<true,rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,rapidjson::CrtAllocator>>
            ((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
              *)source,&local_e8);
  ppGVar6 = internal::Stack<rapidjson::CrtAllocator>::
            Push<rapidjson::GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>const*>
                      (&this->schemaRef_,1);
  *ppGVar6 = source;
  if ((undefined1  [16])
      ((undefined1  [16])
       ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
         *)((long)pCVar2 + 0x10))->data_ & (undefined1  [16])0x400000000000000) ==
      (undefined1  [16])0x0) {
LAB_0014079b:
    pSVar9 = this->typeless_;
    if (schema != (SchemaType **)0x0) {
      *schema = pSVar9;
    }
    AddSchemaRefs(this,pSVar9);
  }
  else {
    SVar4 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetStringLength((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                               *)((long)pCVar2 + 0x10));
    if (SVar4 == 0) {
      SchemaError(this,kSchemaErrorRefInvalid,source);
      goto LAB_0014079b;
    }
    local_138.allocator_ = this->allocator_;
    local_138.frag_ = (Ch *)0x0;
    local_138.path_ = (Ch *)0x0;
    local_138.query_ = (Ch *)0x0;
    local_138.scheme_ = (Ch *)0x0;
    local_138.auth_ = (Ch *)0x0;
    local_138.uri_ = (Ch *)0x0;
    local_138.base_ = (Ch *)0x0;
    local_138.ownAllocator_ = (CrtAllocator *)0x0;
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::operator=(&local_138,id);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
    ::
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>>
              ((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>,rapidjson::CrtAllocator>
                *)&local_248,
               (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)((long)pCVar2 + 0x10),this->allocator_);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Resolve((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *)(local_1f0 + 0x38),&local_248,&local_138,this->allocator_);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri(&local_248);
    local_1f8 = &this->docId_;
    local_b8.parseErrorCode_ = kPointerParseErrorNone;
    local_b8.tokenCount_ = 0;
    local_b8.parseErrorOffset_ = 0;
    local_b8.nameBuffer_ = (Ch *)0x0;
    local_b8.tokens_ = (Token *)0x0;
    local_b8.allocator_ = (CrtAllocator *)0x0;
    local_b8.ownAllocator_ = (CrtAllocator *)0x0;
    local_248.frag_._0_4_ = 0;
    local_248.path_._0_4_ = 0;
    local_248.path_._4_4_ = 0;
    local_248.query_._0_4_ = 0;
    local_248.query_._4_4_ = 0;
    local_248.scheme_ = (Ch *)0x0;
    local_248.auth_ = (Ch *)0x0;
    local_248.uri_ = (Ch *)0x0;
    local_248.base_ = (Ch *)0x0;
    pVVar7 = FindId(this,document,(UriType *)(local_1f0 + 0x38),&local_b8,local_1f8,false,
                    (PointerType *)&local_248);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)&local_248);
    if (pVVar7 == (ValueType *)0x0) {
      pIVar1 = this->remoteProvider_;
      if (pIVar1 == (IRemoteSchemaDocumentProviderType *)0x0) {
        SchemaError(this,kSchemaErrorRefNoRemoteProvider,source);
      }
      else {
        local_78.frag_ = (Ch *)0x0;
        local_78.allocator_ = (CrtAllocator *)0x0;
        local_78.path_ = (Ch *)0x0;
        local_78.query_ = (Ch *)0x0;
        local_78.scheme_ = (Ch *)0x0;
        local_78.auth_ = (Ch *)0x0;
        local_78.uri_ = (Ch *)0x0;
        local_78.base_ = (Ch *)0x0;
        local_78.ownAllocator_ = (CrtAllocator *)0x0;
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::operator=(&local_78,
                    (GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                     *)(local_1f0 + 0x38));
        this_00 = (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *)(**(code **)(*(long *)pIVar1 + 0x18))(pIVar1,&local_78,&this->spec_);
        GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
        ::~GenericUri(&local_78);
        if (this_00 !=
            (GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
             *)0x0) {
          if (local_188 == (char *)0x0) {
            sVar8 = 0;
          }
          else {
            sVar8 = strlen(local_188);
            if ((1 < (uint)sVar8) && (local_188[1] != '/')) {
              SchemaErrorValue(this,kSchemaErrorRefPlainName,source,local_188,(uint)sVar8);
              goto LAB_00140774;
            }
          }
          local_248.uri_ = (Ch *)this->allocator_;
          local_248.base_ = (Ch *)0x0;
          local_248.scheme_ = (Ch *)0x0;
          local_248.auth_ = (Ch *)0x0;
          local_248.path_._0_4_ = 0;
          local_248.path_._4_4_ = 0;
          local_248.query_._0_4_ = 0;
          local_248.query_._4_4_ = 0;
          local_248.frag_._0_4_ = 0;
          GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::Parse((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *)&local_248,local_188,sVar8 & 0xffffffff);
          if ((int)local_248.frag_ == 0) {
            pSVar9 = GetSchema(this_00,(PointerType *)&local_248);
            if (pSVar9 == (SchemaType *)0x0) {
              if ((CrtAllocator *)local_1f0._56_8_ == (CrtAllocator *)0x0) {
                SVar4 = 0;
              }
              else {
                sVar8 = strlen((char *)local_1f0._56_8_);
                SVar4 = (SizeType)sVar8;
              }
              SchemaErrorValue(this,kSchemaErrorRefUnknown,source,(Ch *)local_1f0._56_8_,SVar4);
              goto LAB_001409f7;
            }
            if (schema != (SchemaType **)0x0) {
              *schema = pSVar9;
            }
            AddSchemaRefs(this,pSVar9);
            pGVar12 = &local_248;
            goto LAB_00140a5f;
          }
          SchemaErrorPointer(this,kSchemaErrorRefPointerInvalid,source,local_188,(SizeType)sVar8,
                             (PointerType *)&local_248);
LAB_001409f7:
          pGVar12 = &local_248;
          goto LAB_0014076f;
        }
        if ((CrtAllocator *)local_1f0._56_8_ == (CrtAllocator *)0x0) {
          SVar4 = 0;
        }
        else {
          sVar8 = strlen((char *)local_1f0._56_8_);
          SVar4 = (SizeType)sVar8;
        }
        SchemaErrorValue(this,kSchemaErrorRefNoRemoteSchema,source,(Ch *)local_1f0._56_8_,SVar4);
      }
LAB_00140774:
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericPointer(&local_b8);
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                     *)(local_1f0 + 0x38));
      GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericUri(&local_138);
      goto LAB_0014079b;
    }
    if (local_188 == (char *)0x0) {
      sVar8 = 0;
LAB_00140711:
      local_1f0._0_8_ = this->allocator_;
      local_1f0._8_8_ = (CrtAllocator *)0x0;
      local_1f0._16_8_ = (Ch *)0x0;
      local_1f0._24_8_ = (Token *)0x0;
      local_1f0._32_4_ = 0;
      local_1f0._36_4_ = 0;
      local_1f0._40_4_ = 0;
      local_1f0._44_8_ = 0;
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::Parse((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *)local_1f0,local_188,sVar8 & 0xffffffff);
      if (local_1f0._48_4_ == kPointerParseErrorNone) {
        v_00 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               ::Get((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                      *)local_1f0,pVVar7,(size_t *)0x0);
        if (v_00 != (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)0x0) {
          local_170.allocator_ = this->allocator_;
          local_170.ownAllocator_ = (CrtAllocator *)0x0;
          local_170.nameBuffer_ = (Ch *)0x0;
          local_170.tokens_ = (Token *)0x0;
          local_170.tokenCount_._0_4_ = 0;
          local_170.tokenCount_._4_4_ = 0;
          local_170.parseErrorOffset_._0_4_ = 0;
          local_170._44_8_ = 0;
          GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::operator=(&local_170,&local_b8);
          if (CONCAT44(local_1f0._36_4_,local_1f0._32_4_) != 0) {
            uVar10 = 0;
            uVar11 = 1;
            do {
              GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::Append((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                        *)&local_248,&local_170,(Token *)(local_1f0._24_8_ + uVar10 * 0x10),
                       this->allocator_);
              GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::operator=(&local_170,
                          (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                           *)&local_248);
              GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                                 *)&local_248);
              bVar3 = uVar11 < CONCAT44(local_1f0._36_4_,local_1f0._32_4_);
              uVar10 = uVar11;
              uVar11 = (ulong)((int)uVar11 + 1);
            } while (bVar3);
          }
          pcVar13 = (this->schemaRef_).stack_;
          if (pcVar13 != (this->schemaRef_).stackTop_) {
            do {
              bVar3 = GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                      ::operator==(&local_170,
                                   *(GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                                     **)pcVar13);
              if (bVar3) {
                if ((CrtAllocator *)local_1f0._56_8_ == (CrtAllocator *)0x0) {
                  SVar4 = 0;
                }
                else {
                  sVar8 = strlen((char *)local_1f0._56_8_);
                  SVar4 = (SizeType)sVar8;
                }
                SchemaErrorValue(this,kSchemaErrorRefCyclical,source,(Ch *)local_1f0._56_8_,SVar4);
                GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                ::~GenericPointer(&local_170);
                goto LAB_00140767;
              }
              pcVar13 = pcVar13 + 8;
            } while (pcVar13 != (this->schemaRef_).stackTop_);
          }
          GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::GetUri(&local_248,&local_170,document,local_1f8,&local_f0,this->allocator_);
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::operator=(&local_138,&local_248);
          GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::~GenericUri(&local_248);
          CreateSchema(this,schema,&local_170,v_00,document,&local_138);
          GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
          ::~GenericPointer(&local_170);
          goto LAB_00140948;
        }
        if ((CrtAllocator *)local_1f0._56_8_ == (CrtAllocator *)0x0) {
          SVar4 = 0;
        }
        else {
          sVar8 = strlen((char *)local_1f0._56_8_);
          SVar4 = (SizeType)sVar8;
        }
        SchemaErrorValue(this,kSchemaErrorRefUnknown,source,(Ch *)local_1f0._56_8_,SVar4);
      }
      else {
        SchemaErrorPointer(this,kSchemaErrorRefPointerInvalid,source,local_188,(SizeType)sVar8,
                           (PointerType *)local_1f0);
      }
LAB_00140767:
      pGVar12 = (GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                 *)local_1f0;
LAB_0014076f:
      GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
      ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                         *)pGVar12);
      goto LAB_00140774;
    }
    sVar8 = strlen(local_188);
    if (((uint)sVar8 < 2) || (local_188[1] == '/')) goto LAB_00140711;
    pCVar14 = this->allocator_;
    local_1f0._8_8_ = (CrtAllocator *)0x0;
    local_1f0._16_8_ = (Ch *)0x0;
    local_1f0._24_8_ = (Token *)0x0;
    local_1f0._32_4_ = 0;
    local_1f0._36_4_ = 0;
    local_1f0._40_4_ = 0;
    local_1f0._44_8_ = 0;
    local_1f0._0_8_ = pCVar14;
    if (((this->spec_).oapi & 0xfffffffe) == kVersion20) {
      SchemaErrorValue(this,kSchemaErrorRefPlainName,source,local_188,(uint)sVar8);
      goto LAB_00140767;
    }
    if (local_1b0 == (CrtAllocator *)0x0) {
      len = 0;
    }
    else {
      sVar8 = strlen((char *)local_1b0);
      len = sVar8 & 0xffffffff;
    }
    local_248.path_._0_4_ = 0;
    local_248.path_._4_4_ = 0;
    local_248.query_._0_4_ = 0;
    local_248.query_._4_4_ = 0;
    local_248.scheme_ = (Ch *)0x0;
    local_248.auth_ = (Ch *)0x0;
    local_248.uri_ = (Ch *)0x0;
    local_248.base_ = (Ch *)0x0;
    local_248.frag_._0_4_ = 0;
    local_248.frag_._4_4_ = 0;
    local_248.ownAllocator_ = (CrtAllocator *)0x0;
    local_248.allocator_ = pCVar14;
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::Parse(&local_248,(Ch *)local_1b0,len);
    pVVar7 = FindId(this,pVVar7,(UriType *)(local_1f0 + 0x38),(PointerType *)local_1f0,&local_248,
                    true,&local_b8);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri(&local_248);
    if (pVVar7 == (ValueType *)0x0) {
      code = kSchemaErrorRefUnknown;
      pCVar14 = (CrtAllocator *)local_1f0._56_8_;
LAB_00140b80:
      if (pCVar14 == (CrtAllocator *)0x0) {
        SVar4 = 0;
      }
      else {
        sVar8 = strlen((char *)pCVar14);
        SVar4 = (SizeType)sVar8;
      }
      SchemaErrorValue(this,code,source,(Ch *)pCVar14,SVar4);
      goto LAB_00140767;
    }
    bVar3 = IsCyclicRef(this,(PointerType *)local_1f0);
    if (bVar3) {
      code = kSchemaErrorRefCyclical;
      pCVar14 = (CrtAllocator *)local_1f0._56_8_;
      goto LAB_00140b80;
    }
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::GetUri(&local_248,
             (GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
              *)local_1f0,document,local_1f8,(size_t *)&local_170,this->allocator_);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::operator=(&local_138,&local_248);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri(&local_248);
    CreateSchema(this,schema,(PointerType *)local_1f0,pVVar7,document,&local_138);
LAB_00140948:
    pGVar12 = (GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
               *)local_1f0;
LAB_00140a5f:
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer((GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                       *)pGVar12);
    GenericPointer<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericPointer(&local_b8);
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri((GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
                   *)(local_1f0 + 0x38));
    GenericUri<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>
    ::~GenericUri(&local_138);
  }
  free(local_e8.stack_.stack_);
  operator_delete(local_e8.stack_.ownAllocator_,1);
LAB_001407d3:
  return (Pointer)pCVar2 != CVar5.ptr_;
}

Assistant:

bool HandleRefSchema(const PointerType& source, const SchemaType** schema, const ValueType& v, const ValueType& document, const UriType& id) {
        typename ValueType::ConstMemberIterator itr = v.FindMember(SchemaType::GetRefString());
        if (itr == v.MemberEnd())
            return false;

        GenericStringBuffer<EncodingType> sb;
        source.StringifyUriFragment(sb);
        RAPIDJSON_SCHEMA_PRINT(Method, "GenericSchemaDocument::HandleRefSchema", sb.GetString(), id.GetString());
        // Resolve the source pointer to the $ref'ed schema (finally)
        new (schemaRef_.template Push<SchemaRefPtr>()) SchemaRefPtr(&source);

        if (itr->value.IsString()) {
            SizeType len = itr->value.GetStringLength();
            if (len == 0)
                SchemaError(kSchemaErrorRefInvalid, source);
            else {
                // First resolve $ref against the in-scope id
                UriType scopeId = UriType(id, allocator_);
                UriType ref = UriType(itr->value, allocator_).Resolve(scopeId, allocator_);
                RAPIDJSON_SCHEMA_PRINT(SchemaIds, id.GetString(), itr->value.GetString(), ref.GetString());
                // See if the resolved $ref minus the fragment matches a resolved id in this document
                // Search from the root. Returns the subschema in the document and its absolute JSON pointer.
                PointerType basePointer = PointerType();
                const ValueType *base = FindId(document, ref, basePointer, docId_, false);
                if (!base) {
                    // Remote reference - call the remote document provider
                    if (!remoteProvider_)
                        SchemaError(kSchemaErrorRefNoRemoteProvider, source);
                    else {
                        if (const GenericSchemaDocument* remoteDocument = remoteProvider_->GetRemoteDocument(ref, spec_)) {
                            const Ch* s = ref.GetFragString();
                            len = ref.GetFragStringLength();
                            if (len <= 1 || s[1] == '/') {
                                // JSON pointer fragment, absolute in the remote schema
                                const PointerType pointer(s, len, allocator_);
                                if (!pointer.IsValid())
                                    SchemaErrorPointer(kSchemaErrorRefPointerInvalid, source, s, len, pointer);
                                else {
                                    // Get the subschema
                                    if (const SchemaType *sc = remoteDocument->GetSchema(pointer)) {
                                        if (schema)
                                            *schema = sc;
                                        AddSchemaRefs(const_cast<SchemaType *>(sc));
                                        return true;
                                    } else
                                        SchemaErrorValue(kSchemaErrorRefUnknown, source, ref.GetString(), ref.GetStringLength());
                                }
                            } else
                                // Plain name fragment, not allowed in remote schema
                                SchemaErrorValue(kSchemaErrorRefPlainName, source, s, len);
                        } else
                          SchemaErrorValue(kSchemaErrorRefNoRemoteSchema, source, ref.GetString(), ref.GetStringLength());
                    }
                }
                else { // Local reference
                    const Ch* s = ref.GetFragString();
                    len = ref.GetFragStringLength();
                    if (len <= 1 || s[1] == '/') {
                        // JSON pointer fragment, relative to the resolved URI
                        const PointerType relPointer(s, len, allocator_);
                        if (!relPointer.IsValid())
                            SchemaErrorPointer(kSchemaErrorRefPointerInvalid, source, s, len, relPointer);
                        else {
                            // Get the subschema
                            if (const ValueType *pv = relPointer.Get(*base)) {
                                // Now get the absolute JSON pointer by adding relative to base
                                PointerType pointer(basePointer, allocator_);
                                for (SizeType i = 0; i < relPointer.GetTokenCount(); i++)
                                    pointer = pointer.Append(relPointer.GetTokens()[i], allocator_);
                                if (IsCyclicRef(pointer))
                                    SchemaErrorValue(kSchemaErrorRefCyclical, source, ref.GetString(), ref.GetStringLength());
                                else {
                                    // Call CreateSchema recursively, but first compute the in-scope id for the $ref target as we have jumped there
                                    // TODO: cache pointer <-> id mapping
                                    size_t unresolvedTokenIndex;
                                    scopeId = pointer.GetUri(document, docId_, &unresolvedTokenIndex, allocator_);
                                    CreateSchema(schema, pointer, *pv, document, scopeId);
                                    return true;
                                }
                            } else
                                SchemaErrorValue(kSchemaErrorRefUnknown, source, ref.GetString(), ref.GetStringLength());
                        }
                    } else {
                        // Plain name fragment, relative to the resolved URI
                        // Not supported in open api 2.0 and 3.0
                        PointerType pointer(allocator_);
                        if (spec_.oapi == kVersion20 || spec_.oapi == kVersion30)
                            SchemaErrorValue(kSchemaErrorRefPlainName, source, s, len);
                        // See if the fragment matches an id in this document.
                        // Search from the base we just established. Returns the subschema in the document and its absolute JSON pointer.
                        else if (const ValueType *pv = FindId(*base, ref, pointer, UriType(ref.GetBaseString(), ref.GetBaseStringLength(), allocator_), true, basePointer)) {
                            if (IsCyclicRef(pointer))
                                SchemaErrorValue(kSchemaErrorRefCyclical, source, ref.GetString(), ref.GetStringLength());
                            else {
                                // Call CreateSchema recursively, but first compute the in-scope id for the $ref target as we have jumped there
                                // TODO: cache pointer <-> id mapping
                                size_t unresolvedTokenIndex;
                                scopeId = pointer.GetUri(document, docId_, &unresolvedTokenIndex, allocator_);
                                CreateSchema(schema, pointer, *pv, document, scopeId);
                                return true;
                            }
                        } else
                            SchemaErrorValue(kSchemaErrorRefUnknown, source, ref.GetString(), ref.GetStringLength());
                    }
                }
            }
        }

        // Invalid/Unknown $ref
        if (schema)
            *schema = typeless_;
        AddSchemaRefs(typeless_);
        return true;
    }